

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.h
# Opt level: O0

string * __thiscall
trieste::Location::origin_linecol_abi_cxx11_(string *__return_storage_ptr__,Location *this)

{
  bool bVar1;
  element_type *peVar2;
  string *psVar3;
  type_conflict *ptVar4;
  type_conflict *ptVar5;
  ostream *poVar6;
  pair<unsigned_long,_unsigned_long> pVar7;
  type_conflict *col;
  type_conflict *line;
  unsigned_long local_1b8;
  stringstream local_1a0 [8];
  stringstream ss;
  Location *this_local;
  
  ss._384_8_ = this;
  std::__cxx11::stringstream::stringstream(local_1a0);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this);
  if (bVar1) {
    peVar2 = std::__shared_ptr_access<trieste::SourceDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<trieste::SourceDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    psVar3 = SourceDef::origin_abi_cxx11_(peVar2);
    bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            empty(psVar3);
    if (!bVar1) {
      pVar7 = linecol(this);
      local_1b8 = pVar7.second;
      line = (type_conflict *)pVar7.first;
      ptVar4 = std::get<0ul,unsigned_long,unsigned_long>
                         ((pair<unsigned_long,_unsigned_long> *)&line);
      ptVar5 = std::get<1ul,unsigned_long,unsigned_long>
                         ((pair<unsigned_long,_unsigned_long> *)&line);
      peVar2 = std::
               __shared_ptr_access<trieste::SourceDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<trieste::SourceDef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
      psVar3 = SourceDef::origin_abi_cxx11_(peVar2);
      poVar6 = std::operator<<((ostream *)&ss.field_0x8,(string *)psVar3);
      poVar6 = std::operator<<(poVar6,":");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,*ptVar4 + 1);
      poVar6 = std::operator<<(poVar6,":");
      std::ostream::operator<<(poVar6,*ptVar5 + 1);
    }
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string origin_linecol() const
    {
      std::stringstream ss;

      if (source && !source->origin().empty())
      {
        auto [line, col] = linecol();
        ss << source->origin() << ":" << (line + 1) << ":" << (col + 1);
      }

      return ss.str();
    }